

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::SolveConstrainedSystemDirect
               (MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *lambda,MatrixNd *A,
               VectorNd *b,VectorNd *x,LinearSolver *linear_solver)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_R9;
  Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar1;
  int *in_stack_00000018;
  DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffc48;
  DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *other;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffc50;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc58;
  SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffc60;
  SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *this;
  long in_stack_fffffffffffffc70;
  int iVar2;
  long in_stack_fffffffffffffc78;
  Index in_stack_fffffffffffffc80;
  Index in_stack_fffffffffffffc88;
  DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_2b8 [64];
  Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_278;
  SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> local_268 [160]
  ;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1c8;
  Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_160;
  non_const_type local_70;
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d6ff6);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7008);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (in_R9,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             in_stack_fffffffffffffc70);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_fffffffffffffc50,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc48);
  local_70 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        in_stack_fffffffffffffc48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7074);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7086);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7098);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (in_R9,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             in_stack_fffffffffffffc70);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_fffffffffffffc50,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffc48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7109);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d711e);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7133);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,long>
            (in_R9,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
             in_stack_fffffffffffffc70);
  iVar2 = (int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             in_stack_fffffffffffffc50,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d71a5);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<long,int>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_R9,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,iVar2);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)
             in_stack_fffffffffffffc50,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7220);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x6d7235);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<long,int>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_R9,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,iVar2);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)
             in_stack_fffffffffffffc50,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc48);
  iVar2 = *in_stack_00000018;
  if (iVar2 == 1) {
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::partialPivLu
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc58);
    local_160 = Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc50,
               (DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffc48);
    Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
              ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc50)
    ;
  }
  else if (iVar2 == 2) {
    this = local_268;
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colPivHouseholderQr
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc58);
    local_1c8 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                solve<Eigen::Matrix<double,_1,1,0,_1,1>>(this,in_stack_fffffffffffffc58);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              (in_stack_fffffffffffffc50);
  }
  else if (iVar2 == 3) {
    other = local_2b8;
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQr
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc58);
    SVar1 = Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
            solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                      (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    local_278 = SVar1;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=(SVar1.m_rhs,other);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)SVar1.m_rhs);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void SolveConstrainedSystemDirect (
  Math::MatrixNd &H,
  const Math::MatrixNd &G,
  const Math::VectorNd &c,
  const Math::VectorNd &gamma,
  Math::VectorNd &lambda,
  Math::MatrixNd &A,
  Math::VectorNd &b,
  Math::VectorNd &x,
  Math::LinearSolver &linear_solver
)
{
  // Build the system: Copy H
  A.block(0, 0, c.rows(), c.rows()) = H;

  // Copy G and G^T
  A.block(0, c.rows(), c.rows(), gamma.rows()) = G.transpose();
  A.block(c.rows(), 0, gamma.rows(), c.rows()) = G;

  // Build the system: Copy -C + \tau
  b.block(0, 0, c.rows(), 1) = c;
  b.block(c.rows(), 0, gamma.rows(), 1) = gamma;

  LOG << "A = " << std::endl << A << std::endl;
  LOG << "b = " << std::endl << b << std::endl;

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  switch (linear_solver) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
    assert (0);
    break;
  }
#endif

  LOG << "x = " << std::endl << x << std::endl;
}